

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_unittest.cpp
# Opt level: O0

void __thiscall Allocator_padding_Test::TestBody(Allocator_padding_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_500;
  Message local_4f8;
  int local_4ec;
  size_type local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_25;
  Message local_4c8;
  int local_4bc;
  size_type local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_24;
  Message local_498;
  int local_48c;
  size_type local_488;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_23;
  Message local_468;
  int local_45c;
  size_type local_458;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_22;
  Message local_438;
  int local_42c;
  size_type local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_21;
  Message local_408;
  int local_3fc;
  size_type local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_20;
  Message local_3d8;
  int local_3cc;
  size_type local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_19;
  Message local_3a8;
  int local_39c;
  size_type local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_18;
  Message local_378;
  int local_36c;
  size_type local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_17;
  Message local_348;
  int local_33c;
  size_type local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_16;
  Message local_318;
  int local_30c;
  size_type local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_15;
  Message local_2e8;
  int local_2dc;
  size_type local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_14;
  Message local_2b8;
  int local_2ac;
  size_type local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_13;
  Message local_288;
  int local_27c;
  size_type local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_12;
  Message local_258;
  int local_24c;
  size_type local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_11;
  Message local_228;
  int local_21c;
  size_type local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_10;
  Message local_1f8;
  int local_1ec;
  size_type local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_9;
  Message local_1c8;
  int local_1bc;
  size_type local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_8;
  Message local_198;
  int local_18c;
  size_type local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_7;
  Message local_168;
  int local_15c;
  size_type local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_6;
  Message local_138;
  int local_12c;
  size_type local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_5;
  Message local_108;
  int local_fc;
  size_type local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_4;
  Message local_d8;
  int local_cc;
  size_type local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  Message local_a8;
  int local_9c;
  size_type local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  int local_6c;
  size_type local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  int local_2c;
  size_type local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Allocator_padding_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_28 = memory::impl::get_padding<char>(8,0);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_20,"get_padding<char>(8, 0)","0",&local_28,&local_2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_68 = memory::impl::get_padding<char>(8,1);
  local_6c = 7;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_60,"get_padding<char>(8, 1)","7",&local_68,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_98 = memory::impl::get_padding<char>(8,2);
  local_9c = 6;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_90,"get_padding<char>(8, 2)","6",&local_98,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c8 = memory::impl::get_padding<char>(8,3);
  local_cc = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_c0,"get_padding<char>(8, 3)","5",&local_c8,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_f8 = memory::impl::get_padding<char>(8,4);
  local_fc = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_f0,"get_padding<char>(8, 4)","4",&local_f8,&local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_128 = memory::impl::get_padding<char>(8,5);
  local_12c = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_120,"get_padding<char>(8, 5)","3",&local_128,&local_12c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_158 = memory::impl::get_padding<char>(8,6);
  local_15c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_150,"get_padding<char>(8, 6)","2",&local_158,&local_15c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_188 = memory::impl::get_padding<char>(8,7);
  local_18c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_180,"get_padding<char>(8, 7)","1",&local_188,&local_18c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1b8 = memory::impl::get_padding<char>(8,8);
  local_1bc = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_1b0,"get_padding<char>(8, 8)","0",&local_1b8,&local_1bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1e8 = memory::impl::get_padding<char>(8,9);
  local_1ec = 7;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_1e0,"get_padding<char>(8, 9)","7",&local_1e8,&local_1ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_218 = memory::impl::get_padding<char>(8,10);
  local_21c = 6;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_210,"get_padding<char>(8, 10)","6",&local_218,&local_21c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_248 = memory::impl::get_padding<char>(8,0xb);
  local_24c = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_240,"get_padding<char>(8, 11)","5",&local_248,&local_24c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  local_278 = memory::impl::get_padding<char>(8,0xc);
  local_27c = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_270,"get_padding<char>(8, 12)","4",&local_278,&local_27c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2a8 = memory::impl::get_padding<char>(8,0xd);
  local_2ac = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_2a0,"get_padding<char>(8, 13)","3",&local_2a8,&local_2ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_2d8 = memory::impl::get_padding<char>(8,0xe);
  local_2dc = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_2d0,"get_padding<char>(8, 14)","2",&local_2d8,&local_2dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_308 = memory::impl::get_padding<char>(8,0xf);
  local_30c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_300,"get_padding<char>(8, 15)","1",&local_308,&local_30c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_338 = memory::impl::get_padding<char>(8,0x10);
  local_33c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_330,"get_padding<char>(8, 16)","0",&local_338,&local_33c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_368 = memory::impl::get_padding<double>(0x40,0);
  local_36c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_360,"get_padding<double>(64, 0)","0",&local_368,&local_36c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  local_398 = memory::impl::get_padding<double>(0x40,1);
  local_39c = 7;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_390,"get_padding<double>(64, 1)","7",&local_398,&local_39c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3c8 = memory::impl::get_padding<double>(0x40,2);
  local_3cc = 6;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_3c0,"get_padding<double>(64, 2)","6",&local_3c8,&local_3cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_3f8 = memory::impl::get_padding<double>(0x40,3);
  local_3fc = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_3f0,"get_padding<double>(64, 3)","5",&local_3f8,&local_3fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_428 = memory::impl::get_padding<double>(0x40,4);
  local_42c = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_420,"get_padding<double>(64, 4)","4",&local_428,&local_42c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  local_458 = memory::impl::get_padding<double>(0x40,5);
  local_45c = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_450,"get_padding<double>(64, 5)","3",&local_458,&local_45c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  local_488 = memory::impl::get_padding<double>(0x40,6);
  local_48c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_480,"get_padding<double>(64, 6)","2",&local_488,&local_48c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  local_4b8 = memory::impl::get_padding<double>(0x40,7);
  local_4bc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_4b0,"get_padding<double>(64, 7)","1",&local_4b8,&local_4bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4e8 = memory::impl::get_padding<double>(0x40,8);
  local_4ec = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_4e0,"get_padding<double>(64, 8)","0",&local_4e8,&local_4ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  return;
}

Assistant:

TEST(Allocator, padding) {
    using namespace memory::impl;

    EXPECT_EQ( get_padding<char>(8,  0), 0 );
    EXPECT_EQ( get_padding<char>(8,  1), 7 );
    EXPECT_EQ( get_padding<char>(8,  2), 6 );
    EXPECT_EQ( get_padding<char>(8,  3), 5 );
    EXPECT_EQ( get_padding<char>(8,  4), 4 );
    EXPECT_EQ( get_padding<char>(8,  5), 3 );
    EXPECT_EQ( get_padding<char>(8,  6), 2 );
    EXPECT_EQ( get_padding<char>(8,  7), 1 );
    EXPECT_EQ( get_padding<char>(8,  8), 0 );

    EXPECT_EQ( get_padding<char>(8,  9), 7 );
    EXPECT_EQ( get_padding<char>(8, 10), 6 );
    EXPECT_EQ( get_padding<char>(8, 11), 5 );
    EXPECT_EQ( get_padding<char>(8, 12), 4 );
    EXPECT_EQ( get_padding<char>(8, 13), 3 );
    EXPECT_EQ( get_padding<char>(8, 14), 2 );
    EXPECT_EQ( get_padding<char>(8, 15), 1 );
    EXPECT_EQ( get_padding<char>(8, 16), 0 );

    EXPECT_EQ( get_padding<double>(64, 0), 0 );
    EXPECT_EQ( get_padding<double>(64, 1), 7 );
    EXPECT_EQ( get_padding<double>(64, 2), 6 );
    EXPECT_EQ( get_padding<double>(64, 3), 5 );
    EXPECT_EQ( get_padding<double>(64, 4), 4 );
    EXPECT_EQ( get_padding<double>(64, 5), 3 );
    EXPECT_EQ( get_padding<double>(64, 6), 2 );
    EXPECT_EQ( get_padding<double>(64, 7), 1 );
    EXPECT_EQ( get_padding<double>(64, 8), 0 );
}